

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

uint32_t __thiscall
spirv_cross::Compiler::PhysicalStorageBufferPointerHandler::get_base_non_block_type_id
          (PhysicalStorageBufferPointerHandler *this,uint32_t type_id)

{
  Compiler *pCVar1;
  SPIRType *pSVar2;
  SPIRType *pSVar3;
  ulong uVar4;
  
  uVar4 = (ulong)type_id;
  pCVar1 = this->compiler;
  while( true ) {
    pSVar2 = Variant::get<spirv_cross::SPIRType>
                       ((pCVar1->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + uVar4);
    if ((*(int *)&(pSVar2->super_IVariant).field_0xc != 0x20) ||
       (pSVar2->storage != StorageClassPhysicalStorageBuffer)) break;
    pSVar3 = Variant::get<spirv_cross::SPIRType>
                       ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + uVar4)
    ;
    if ((*(int *)&(pSVar3->super_IVariant).field_0xc == 0x20) &&
       (pSVar3->storage == StorageClassPhysicalStorageBuffer)) break;
    uVar4 = (ulong)(pSVar2->parent_type).id;
    pCVar1 = this->compiler;
  }
  pSVar2 = Variant::get<spirv_cross::SPIRType>
                     ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + uVar4);
  if ((*(int *)&(pSVar2->super_IVariant).field_0xc == 0x20) &&
     (pSVar2->storage == StorageClassPhysicalStorageBuffer)) {
    return (uint32_t)uVar4;
  }
  __assert_fail("type_is_bda_block_entry(type_id)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_cross.cpp"
                ,0x14af,
                "uint32_t spirv_cross::Compiler::PhysicalStorageBufferPointerHandler::get_base_non_block_type_id(uint32_t) const"
               );
}

Assistant:

uint32_t Compiler::PhysicalStorageBufferPointerHandler::get_base_non_block_type_id(uint32_t type_id) const
{
	auto *type = &compiler.get<SPIRType>(type_id);
	while (compiler.is_physical_pointer(*type) && !type_is_bda_block_entry(type_id))
	{
		type_id = type->parent_type;
		type = &compiler.get<SPIRType>(type_id);
	}

	assert(type_is_bda_block_entry(type_id));
	return type_id;
}